

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O0

Type __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::common_type<std::initializer_list<int>>
          (FlatModel<mp::DefaultFlatModelParams> *this,initializer_list<int> *va)

{
  bool bVar1;
  FlatModel<mp::DefaultFlatModelParams> *this_00;
  initializer_list<int> *in_RSI;
  FlatModel<mp::DefaultFlatModelParams> *in_RDI;
  int v;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<int> *__range3;
  Type type;
  int in_stack_ffffffffffffffbc;
  int v_00;
  FlatModel<mp::DefaultFlatModelParams> *local_28;
  
  local_28 = (FlatModel<mp::DefaultFlatModelParams> *)std::initializer_list<int>::begin(in_RSI);
  this_00 = (FlatModel<mp::DefaultFlatModelParams> *)
            std::initializer_list<int>::end((initializer_list<int> *)in_RDI);
  do {
    if (local_28 == this_00) {
      return INTEGER;
    }
    v_00 = *(int *)&(local_28->super_BasicFlatModel)._vptr_BasicFlatModel;
    bVar1 = is_integer_var(in_RDI,in_stack_ffffffffffffffbc);
    if (!bVar1) {
      bVar1 = is_fixed(this_00,v_00);
      if (!bVar1) {
        return CONTINUOUS;
      }
      fixed_value(in_RDI,in_stack_ffffffffffffffbc);
      bVar1 = is_integer_value<double>((double)in_RDI);
      if (!bVar1) {
        return CONTINUOUS;
      }
    }
    local_28 = (FlatModel<mp::DefaultFlatModelParams> *)
               ((long)&(local_28->super_BasicFlatModel)._vptr_BasicFlatModel + 4);
  } while( true );
}

Assistant:

var::Type common_type(const VarArray& va) const {
    auto type = var::Type::INTEGER;
    for (auto v: va) {
      if (!is_integer_var(v) &&
          (!is_fixed(v) || !is_integer_value(fixed_value(v)))) {
        type = var::Type::CONTINUOUS;
        break;
      }
    }
    return type;
  }